

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O2

String * capnp::compiler::anon_unknown_0::doLex<capnp::compiler::LexedTokens>
                   (String *__return_storage_ptr__,StringPtr constText)

{
  Builder result;
  bool bVar1;
  char *c;
  char *pcVar2;
  size_t in_RCX;
  char *pcVar3;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params;
  String *__range3;
  size_t sVar4;
  StringPtr value;
  ArrayPtr<const_char> input;
  TestFailingErrorReporter errorReporter;
  String text;
  Builder file;
  MallocMessageBuilder message;
  
  value.content.ptr = (char *)constText.content.size_;
  value.content.size_ = in_RCX;
  kj::heapString(&text,(kj *)constText.content.ptr,value);
  pcVar3 = text.content.ptr + (text.content.size_ - 1);
  pcVar2 = text.content.ptr;
  if (text.content.size_ == 0) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
  for (; pcVar2 != pcVar3; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == '\'') {
      *pcVar2 = '\"';
    }
  }
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>(&file,&message.super_MessageBuilder);
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_00660458;
  pcVar3 = (char *)text.content.size_;
  if (text.content.size_ != 0) {
    pcVar3 = text.content.ptr;
  }
  sVar4 = 0;
  if (text.content.size_ != 0) {
    sVar4 = text.content.size_ - 1;
  }
  result._builder.capTable = file._builder.capTable;
  result._builder.segment = file._builder.segment;
  result._builder.data = file._builder.data;
  result._builder.pointers = file._builder.pointers;
  result._builder.dataSize = file._builder.dataSize;
  result._builder.pointerCount = file._builder.pointerCount;
  result._builder._38_2_ = file._builder._38_2_;
  input.size_ = sVar4;
  input.ptr = pcVar3;
  bVar1 = lex(input,result,&errorReporter.super_ErrorReporter);
  params = extraout_RDX;
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"lex(text, file, errorReporter)\"",
               (char (*) [48])"failed: expected lex(text, file, errorReporter)");
    params = extraout_RDX_00;
  }
  kj::str<capnp::compiler::LexedTokens::Builder&>(__return_storage_ptr__,(kj *)&file,params);
  pcVar2 = (__return_storage_ptr__->content).ptr;
  sVar4 = (__return_storage_ptr__->content).size_;
  pcVar3 = pcVar2 + (sVar4 - 1);
  if (sVar4 == 0) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
  for (; pcVar2 != pcVar3; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == '\"') {
      *pcVar2 = '\'';
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  kj::Array<char>::~Array(&text.content);
  return __return_storage_ptr__;
}

Assistant:

kj::String doLex(kj::StringPtr constText) {
  // Parse the given string into the given Cap'n Proto struct type using lex(), then stringify the
  // result and return that string.  Additionally, single quotes in the input are converted to
  // double quotes, and double quotes in the output are converted to single quotes, to reduce the
  // amount of escaping needed in the test strings.
  //
  // Comparing stringifications against golden strings is ugly and brittle.  If we had a
  // text-format parser we could use that.  Except that said parser would probably be built on
  // the very lexer being tested here, so...  maybe this is the best we can reasonably do.

  kj::String text = heapString(constText);
  for (char& c: text) {
    // Make it easier to write input strings below.
    if (c == '\'') c = '\"';
  }
  MallocMessageBuilder message;
  auto file = message.initRoot<LexResult>();
  TestFailingErrorReporter errorReporter;
  EXPECT_TRUE(lex(text, file, errorReporter));
  kj::String result = kj::str(file);
  for (char& c: result) {
    // Make it easier to write golden strings below.
    if (c == '\"') c = '\'';
  }
  return result;
}